

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfgmr.c
# Opt level: O2

int zfgmr(int n,_func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *zmatvec,
         _func_void_int_doublecomplex_ptr_doublecomplex_ptr *zpsolve,doublecomplex *rhs,
         doublecomplex *sol,double tol,int im,int *itmax,FILE *fits)

{
  ulong uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  doublereal dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  long *addr;
  doublecomplex *pdVar20;
  ulong uVar21;
  long lVar22;
  double *pdVar23;
  int i_3;
  uint uVar24;
  doublecomplex *pdVar25;
  int i;
  long lVar26;
  ulong uVar27;
  void *addr_00;
  long lVar28;
  double dVar29;
  size_t sVar30;
  double dVar31;
  int n_local;
  uint local_f4;
  doublereal local_f0;
  void *local_e8;
  doublecomplex *local_e0;
  double local_d8;
  uint local_cc;
  ulong local_c8;
  void *local_c0;
  double local_b8;
  ulong local_b0;
  doublecomplex *local_a8;
  doublecomplex *local_a0;
  doublecomplex local_98;
  double local_80;
  _func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *local_78;
  uint local_6c;
  int i_2;
  int i_1;
  doublecomplex *local_60;
  doublecomplex *local_58;
  long local_50;
  size_t local_48;
  _func_void_int_doublecomplex_ptr_doublecomplex_ptr *local_40;
  double *local_38;
  
  local_c8 = (ulong)(uint)*itmax;
  i_1 = 1;
  i_2 = 2;
  sVar30 = (size_t)im;
  n_local = n;
  local_cc = im;
  local_80 = tol;
  local_78 = zmatvec;
  local_60 = rhs;
  local_58 = sol;
  local_40 = zpsolve;
  addr = (long *)superlu_malloc(sVar30 * 8 + 8);
  for (lVar26 = 0; lVar26 <= (long)sVar30; lVar26 = lVar26 + 1) {
    pdVar20 = doublecomplexMalloc((long)n);
    addr[lVar26] = (long)pdVar20;
  }
  local_c0 = superlu_malloc(sVar30 * 8);
  local_e8 = superlu_malloc(sVar30 * 8);
  uVar27 = 0;
  local_b0 = 0;
  if (0 < im) {
    local_b0 = (ulong)local_cc;
  }
  for (; local_b0 != uVar27; uVar27 = uVar27 + 1) {
    pdVar20 = doublecomplexMalloc(uVar27 + 2);
    *(doublecomplex **)((long)local_e8 + uVar27 * 8) = pdVar20;
    pdVar20 = doublecomplexMalloc((long)n);
    *(doublecomplex **)((long)local_c0 + uVar27 * 8) = pdVar20;
  }
  local_a0 = doublecomplexMalloc(sVar30);
  local_48 = sVar30;
  local_a8 = doublecomplexMalloc(sVar30);
  local_e0 = doublecomplexMalloc(sVar30 + 1);
  local_6c = (int)local_c8 + 10;
  local_38 = &local_e0[1].i;
  local_b8 = 0.0;
  local_f4 = 0;
  pdVar25 = local_58;
  addr_00 = local_c0;
  pdVar20 = local_60;
  while( true ) {
    (*local_78)((doublecomplex)ZEXT816(0x3ff0000000000000),pdVar25,(doublecomplex)ZEXT816(0),
                (doublecomplex *)*addr);
    uVar27 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar27 = 0;
    }
    for (lVar26 = 0; uVar27 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
      pdVar23 = (double *)((long)&pdVar20->r + lVar26);
      pdVar2 = (double *)(*addr + lVar26);
      dVar29 = pdVar23[1] - pdVar2[1];
      auVar7._8_4_ = SUB84(dVar29,0);
      auVar7._0_8_ = *pdVar23 - *pdVar2;
      auVar7._12_4_ = (int)((ulong)dVar29 >> 0x20);
      *(undefined1 (*) [16])(*addr + lVar26) = auVar7;
    }
    local_f0 = dznrm2_(&n_local,(doublecomplex *)*addr,&i_1);
    if ((fits != (FILE *)0x0) && (local_f4 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(local_f0,0),0);
    }
    dVar13 = dznrm2_(&n_local,pdVar20,&i_1);
    uVar24 = local_f4;
    if (local_f0 <= dVar13 * local_80) break;
    uVar27 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar27 = 0;
    }
    for (lVar26 = 0; uVar27 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
      pdVar23 = (double *)(*addr + lVar26);
      dVar29 = pdVar23[1];
      pdVar2 = (double *)(*addr + lVar26);
      *pdVar2 = *pdVar23 * (1.0 / local_f0);
      pdVar2[1] = dVar29 * (1.0 / local_f0);
    }
    if (local_f4 == 0) {
      local_b8 = local_f0 * local_80;
    }
    local_e0->r = local_f0;
    local_e0->i = 0.0;
    lVar28 = 0;
    lVar26 = 1;
    uVar27 = 0;
    do {
      uVar21 = local_b0;
      if (uVar27 == local_b0) break;
      local_50 = lVar28;
      if (local_40 == (_func_void_int_doublecomplex_ptr_doublecomplex_ptr *)0x0) {
        zcopy_(&n_local,(doublecomplex *)addr[uVar27],&i_1,
               *(doublecomplex **)((long)addr_00 + uVar27 * 8),&i_1);
      }
      else {
        (*local_40)(n_local,*(doublecomplex **)((long)addr_00 + uVar27 * 8),
                    (doublecomplex *)addr[uVar27]);
      }
      local_f4 = local_f4 + 1;
      uVar1 = uVar27 + 1;
      (*local_78)((doublecomplex)ZEXT816(0x3ff0000000000000),
                  *(doublecomplex **)((long)addr_00 + uVar27 * 8),(doublecomplex)ZEXT816(0),
                  (doublecomplex *)addr[uVar1]);
      local_f0 = dznrm2_(&n_local,(doublecomplex *)addr[uVar1],&i_1);
      for (lVar28 = 0; lVar28 != lVar26; lVar28 = lVar28 + 1) {
        uVar21 = (ulong)(uint)n_local;
        if (n_local < 1) {
          uVar21 = 0;
        }
        dVar29 = 0.0;
        dVar31 = 0.0;
        lVar22 = 0;
        while( true ) {
          uVar24 = (uint)((ulong)dVar31 >> 0x20);
          if (uVar21 * 0x10 == lVar22) break;
          dVar14 = *(double *)(addr[lVar28] + lVar22);
          dVar15 = ((double *)(addr[lVar28] + lVar22))[1];
          dVar4 = *(double *)(addr[uVar1] + lVar22);
          dVar5 = *(double *)(addr[uVar1] + 8 + lVar22);
          dVar29 = dVar29 + dVar4 * dVar14 + dVar5 * dVar15;
          dVar31 = dVar31 + dVar4 * -dVar15 + dVar5 * dVar14;
          lVar22 = lVar22 + 0x10;
        }
        auVar8._8_4_ = SUB84(dVar31,0);
        auVar8._0_8_ = dVar29;
        auVar8._12_4_ = uVar24;
        *(undefined1 (*) [16])(*(long *)((long)local_e8 + uVar27 * 8) + lVar28 * 0x10) = auVar8;
        local_98.i._0_4_ = SUB84(dVar31,0);
        local_98.r = -dVar29;
        local_98.i._4_4_ = uVar24 ^ 0x80000000;
        zaxpy_(&n_local,&local_98,(doublecomplex *)addr[lVar28],&i_1,(doublecomplex *)addr[uVar1],
               &i_1);
      }
      while( true ) {
        local_d8 = local_f0;
        local_f0 = dznrm2_(&n_local,(doublecomplex *)addr[uVar1],&i_1);
        addr_00 = local_c0;
        if (local_d8 * 0.5 <= local_f0) break;
        for (lVar28 = 0; lVar28 != lVar26; lVar28 = lVar28 + 1) {
          uVar21 = (ulong)(uint)n_local;
          if (n_local < 1) {
            uVar21 = 0;
          }
          dVar29 = 0.0;
          dVar31 = 0.0;
          for (lVar22 = 0; uVar21 * 0x10 != lVar22; lVar22 = lVar22 + 0x10) {
            dVar14 = *(double *)(addr[lVar28] + lVar22);
            dVar15 = ((double *)(addr[lVar28] + lVar22))[1];
            dVar4 = *(double *)(addr[uVar1] + lVar22);
            dVar5 = *(double *)(addr[uVar1] + 8 + lVar22);
            dVar29 = dVar29 + dVar4 * dVar14 + dVar5 * dVar15;
            dVar31 = dVar31 + dVar4 * -dVar15 + dVar5 * dVar14;
          }
          lVar22 = *(long *)((long)local_e8 + uVar27 * 8);
          pdVar23 = (double *)(lVar22 + lVar28 * 0x10);
          dVar4 = pdVar23[1];
          pdVar2 = (double *)(lVar22 + lVar28 * 0x10);
          *pdVar2 = *pdVar23 + dVar29;
          pdVar2[1] = dVar4 + dVar31;
          local_98.i._0_4_ = SUB84(dVar31,0);
          local_98.r = -dVar29;
          local_98.i._4_4_ = (uint)((ulong)dVar31 >> 0x20) ^ 0x80000000;
          zaxpy_(&n_local,&local_98,(doublecomplex *)addr[lVar28],&i_1,(doublecomplex *)addr[uVar1],
                 &i_1);
        }
      }
      lVar28 = *(long *)((long)local_e8 + uVar27 * 8);
      local_d8 = (double)(uVar1 * 0x10);
      *(doublereal *)(lVar28 + (long)local_d8) = local_f0;
      *(undefined8 *)(lVar28 + 8 + (long)local_d8) = 0;
      if ((local_f0 != 0.0) || (NAN(local_f0))) {
        uVar21 = (ulong)(uint)n_local;
        if (n_local < 1) {
          uVar21 = 0;
        }
        for (lVar22 = 0; uVar21 * 0x10 != lVar22; lVar22 = lVar22 + 0x10) {
          pdVar23 = (double *)(addr[uVar1] + lVar22);
          dVar29 = pdVar23[1];
          pdVar2 = (double *)(addr[uVar1] + lVar22);
          *pdVar2 = *pdVar23 * (1.0 / local_f0);
          pdVar2[1] = dVar29 * (1.0 / local_f0);
        }
      }
      for (lVar22 = 0; local_50 != lVar22; lVar22 = lVar22 + 0x10) {
        pdVar23 = (double *)((long)&local_a0->r + lVar22);
        dVar14 = *pdVar23;
        dVar15 = pdVar23[1];
        dVar29 = *(double *)(lVar28 + lVar22);
        dVar31 = *(double *)(lVar28 + 8 + lVar22);
        dVar4 = *(double *)(lVar28 + 0x10 + lVar22);
        dVar5 = *(double *)(lVar28 + 0x18 + lVar22);
        pdVar23 = (double *)((long)&local_a8->r + lVar22);
        dVar16 = *pdVar23;
        dVar17 = pdVar23[1];
        *(double *)(lVar28 + lVar22) =
             dVar16 * dVar4 + -dVar17 * dVar5 + dVar14 * dVar29 + -dVar15 * dVar31;
        ((double *)(lVar28 + lVar22))[1] =
             dVar17 * dVar4 + dVar16 * dVar5 + dVar15 * dVar29 + dVar14 * dVar31;
        pdVar23 = (double *)((long)&local_a8->r + lVar22);
        dVar14 = *pdVar23;
        dVar15 = pdVar23[1];
        pdVar23 = (double *)((long)&local_a0->r + lVar22);
        dVar16 = *pdVar23;
        dVar17 = pdVar23[1];
        pdVar23 = (double *)(lVar28 + 0x10 + lVar22);
        *pdVar23 = (dVar4 * dVar16 + -dVar17 * dVar5) - (dVar29 * dVar14 + -dVar15 * dVar31);
        pdVar23[1] = (dVar4 * dVar17 + dVar16 * dVar5) - (dVar29 * dVar15 + dVar14 * dVar31);
      }
      local_f0 = (doublereal)(uVar27 * 0x10);
      dVar13 = dznrm2_(&i_2,(doublecomplex *)(lVar28 + (long)local_f0),&i_1);
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        dVar31 = 1.0 / dVar13;
        lVar28 = *(long *)((long)local_e8 + uVar27 * 8);
        dVar29 = ((double *)(lVar28 + (long)local_f0))[1] * dVar31;
        auVar11._8_4_ = SUB84(dVar29,0);
        auVar11._0_8_ = *(double *)(lVar28 + (long)local_f0) * dVar31;
        auVar11._12_4_ = (int)((ulong)dVar29 >> 0x20);
        *(undefined1 (*) [16])((long)&local_a0->r + (long)local_f0) = auVar11;
        dVar29 = *(double *)(lVar28 + (long)local_d8) * dVar31;
        dVar31 = ((double *)(lVar28 + (long)local_d8))[1] * dVar31;
        auVar12._8_4_ = SUB84(dVar31,0);
        auVar12._0_8_ = dVar29;
        auVar12._12_4_ = (int)((ulong)dVar31 >> 0x20);
        *(undefined1 (*) [16])((long)&local_a8->r + (long)local_f0) = auVar12;
      }
      else {
        puVar3 = (undefined8 *)((long)&local_a0->r + (long)local_f0);
        *puVar3 = 0x3ff0000000000000;
        puVar3[1] = 0;
        dVar29 = 0.0;
        dVar31 = 0.0;
        puVar3 = (undefined8 *)((long)&local_a8->r + (long)local_f0);
        *puVar3 = 0;
        puVar3[1] = 0;
        lVar28 = *(long *)((long)local_e8 + uVar27 * 8);
      }
      dVar4 = *(double *)((long)&local_e0->r + (long)local_f0);
      dVar5 = *(double *)((long)&local_e0->i + (long)local_f0);
      dVar14 = dVar31 * dVar4 + dVar29 * dVar5;
      auVar9._8_4_ = SUB84(dVar14,0);
      auVar9._0_8_ = -(dVar29 * dVar4 + -dVar31 * dVar5);
      auVar9._12_4_ = (uint)((ulong)dVar14 >> 0x20) ^ 0x80000000;
      *(undefined1 (*) [16])((long)&local_e0->r + (long)local_d8) = auVar9;
      pdVar23 = (double *)((long)&local_a0->r + (long)local_f0);
      dVar29 = *pdVar23;
      dVar31 = pdVar23[1];
      pdVar23 = (double *)((long)&local_e0->r + (long)local_f0);
      *pdVar23 = dVar4 * dVar29 + -dVar31 * dVar5;
      pdVar23[1] = dVar4 * dVar31 + dVar29 * dVar5;
      pdVar23 = (double *)((long)&local_a0->r + (long)local_f0);
      dVar14 = *pdVar23;
      dVar15 = pdVar23[1];
      dVar29 = *(double *)(lVar28 + (long)local_f0);
      dVar31 = *(double *)(lVar28 + 8 + (long)local_f0);
      pdVar23 = (double *)((long)&local_a8->r + (long)local_f0);
      dVar16 = *pdVar23;
      dVar17 = pdVar23[1];
      dVar4 = *(double *)(lVar28 + (long)local_d8);
      dVar5 = *(double *)(lVar28 + 8 + (long)local_d8);
      *(double *)(lVar28 + (long)local_f0) =
           dVar4 * dVar16 + -dVar17 * dVar5 + dVar29 * dVar14 + -dVar15 * dVar31;
      ((double *)(lVar28 + (long)local_f0))[1] =
           dVar4 * dVar17 + dVar16 * dVar5 + dVar29 * dVar15 + dVar14 * dVar31;
      dVar29 = z_abs1((doublecomplex *)((long)&local_e0->r + (long)local_d8));
      if (fits != (FILE *)0x0) {
        local_f0 = dVar29;
        fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(dVar29,0),(ulong)local_f4);
        dVar29 = local_f0;
      }
      uVar21 = uVar27;
      if (dVar29 <= local_b8) break;
      lVar26 = lVar26 + 1;
      lVar28 = local_50 + 0x10;
      uVar27 = uVar1;
    } while ((int)local_f4 < (int)local_c8);
    uVar24 = (uint)uVar21;
    iVar18 = uVar24 - (uVar24 == local_cc);
    local_d8 = (double)(ulong)-(uint)(uVar24 == local_cc);
    lVar26 = (long)iVar18;
    z_div(local_e0 + lVar26,local_e0 + lVar26,
          (doublecomplex *)(lVar26 * 0x10 + *(long *)((long)local_e8 + lVar26 * 8)));
    iVar19 = 0;
    if (0 < iVar18) {
      iVar19 = iVar18;
    }
    local_f0 = (doublereal)(ulong)(iVar19 + 1);
    for (dVar29 = 4.94065645841247e-324; pdVar25 = local_58, pdVar20 = local_60, addr_00 = local_c0,
        iVar18 = iVar18 + -1, dVar29 != local_f0; dVar29 = (double)((long)dVar29 + 1)) {
      lVar28 = (long)iVar18;
      pdVar23 = local_38 + lVar28 * 2;
      lVar22 = lVar26 - (long)dVar29;
      pdVar20 = local_e0 + lVar22;
      dVar31 = pdVar20->r;
      dVar4 = pdVar20->i;
      local_98 = *pdVar20;
      for (; lVar28 < lVar26; lVar28 = lVar28 + 1) {
        pdVar2 = (double *)(*(long *)((long)local_e8 + lVar28 * 8 + 8) + lVar22 * 0x10);
        dVar5 = *pdVar2;
        dVar14 = pdVar2[1];
        dVar31 = dVar31 - (((doublecomplex *)(pdVar23 + -1))->r * dVar5 + -dVar14 * *pdVar23);
        dVar4 = dVar4 - (((doublecomplex *)(pdVar23 + -1))->r * dVar14 + dVar5 * *pdVar23);
        local_98.i._0_4_ = SUB84(dVar4,0);
        local_98.r = dVar31;
        local_98.i._4_4_ = (int)((ulong)dVar4 >> 0x20);
        pdVar23 = pdVar23 + 2;
      }
      z_div(local_e0 + lVar22,&local_98,
            (doublecomplex *)(lVar22 * 0x10 + *(long *)((long)local_e8 + lVar22 * 8)));
    }
    uVar27 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar27 = 0;
    }
    for (uVar21 = 0; uVar21 != SUB84(local_d8,0) + uVar24 + 1; uVar21 = uVar21 + 1) {
      dVar29 = local_e0[uVar21].r;
      dVar31 = local_e0[uVar21].i;
      for (lVar26 = 0; uVar27 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
        lVar28 = *(long *)((long)local_c0 + uVar21 * 8);
        dVar4 = *(double *)(lVar28 + lVar26);
        dVar5 = *(double *)(lVar28 + 8 + lVar26);
        pdVar23 = (double *)((long)&local_58->r + lVar26);
        dVar14 = pdVar23[1];
        pdVar2 = (double *)((long)&local_58->r + lVar26);
        *pdVar2 = *pdVar23 + dVar4 * dVar29 + dVar5 * -dVar31;
        pdVar2[1] = dVar14 + dVar4 * dVar31 + dVar5 * dVar29;
      }
    }
    (*local_78)((doublecomplex)ZEXT816(0x3ff0000000000000),local_58,(doublecomplex)ZEXT816(0),
                (doublecomplex *)*addr);
    uVar27 = (ulong)(uint)n_local;
    if (n_local < 1) {
      uVar27 = 0;
    }
    for (lVar26 = 0; uVar27 * 0x10 != lVar26; lVar26 = lVar26 + 0x10) {
      pdVar23 = (double *)((long)&pdVar20->r + lVar26);
      pdVar2 = (double *)(*addr + lVar26);
      dVar29 = pdVar23[1] - pdVar2[1];
      auVar10._8_4_ = SUB84(dVar29,0);
      auVar10._0_8_ = *pdVar23 - *pdVar2;
      auVar10._12_4_ = (int)((ulong)dVar29 >> 0x20);
      *(undefined1 (*) [16])(*addr + lVar26) = auVar10;
    }
    dVar13 = dznrm2_(&n_local,(doublecomplex *)*addr,&i_1);
    uVar24 = local_6c;
    if (((local_b8 / local_80 <= dVar13) || (uVar24 = local_f4, dVar13 <= local_b8)) ||
       ((int)local_c8 <= (int)local_f4)) break;
  }
  local_f4 = uVar24;
  sVar30 = local_48;
  for (lVar26 = 0; lVar26 <= (long)sVar30; lVar26 = lVar26 + 1) {
    superlu_free((void *)addr[lVar26]);
  }
  superlu_free(addr);
  for (uVar27 = 0; uVar24 = local_f4, local_b0 != uVar27; uVar27 = uVar27 + 1) {
    superlu_free(*(void **)((long)local_e8 + uVar27 * 8));
    superlu_free(*(void **)((long)addr_00 + uVar27 * 8));
  }
  bVar6 = (int)local_c8 <= (int)local_f4;
  superlu_free(local_e8);
  superlu_free(addr_00);
  superlu_free(local_a0);
  superlu_free(local_a8);
  superlu_free(local_e0);
  *itmax = uVar24;
  return (int)bVar6;
}

Assistant:

int zfgmr(int n,
     void (*zmatvec) (doublecomplex, doublecomplex[], doublecomplex, doublecomplex[]),
     void (*zpsolve) (int, doublecomplex[], doublecomplex[]),
     doublecomplex *rhs, doublecomplex *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    double eps1 = 0.0;
    doublecomplex **hh, *c, *s, *rs;
    doublecomplex **vv, **z;
    doublecomplex zero = {0.0, 0.0};
    doublecomplex one = {1.0, 0.0};
    doublecomplex tt1, tt2;

    its = 0;
    vv = (doublecomplex **)SUPERLU_MALLOC((im + 1) * sizeof(doublecomplex *));
    for (int i = 0; i <= im; i++) vv[i] = doublecomplexMalloc(n);
    z = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    hh = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = doublecomplexMalloc(i + 2);
	z[i] = doublecomplexMalloc(n);
    }
    c = doublecomplexMalloc(im);
    s = doublecomplexMalloc(im);
    rs = doublecomplexMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);	/* vv[0]= initial residual */
	double beta = dznrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * dznrm2_(&n, rhs, &i_1)) )
	    break;
	double t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    zd_mult(&vv[0][j], &vv[0][j], t);
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0].r = beta;
	rs[0].i = 0.0;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (zpsolve)
		zpsolve(n, z[i], vv[i]);
	    else
		zcopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    zmatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    double t0 = dznrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		doublecomplex negt;
#if 0
		zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
		doublecomplex tt = zero;
		for (int k = 0; k < n; ++k) {
		    zz_conj(&tt1, &vv[j][k]);
		    zz_mult(&tt2, &tt1, &vv[i1][k]);
		    z_add(&tt, &tt, &tt2);
		}
#endif
		hh[i][j] = tt;
		negt.r = -tt.r;
		negt.i = -tt.i;
		zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = dznrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    doublecomplex negt;
#if 0
		    zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
   	            doublecomplex tt = zero;
		    for (int k = 0; k < n; ++k) {
		        zz_conj(&tt1, &vv[j][k]);
		        zz_mult(&tt2, &tt1, &vv[i1][k]);
		        z_add(&tt, &tt, &tt2);
		    }
#endif
		    z_add(&hh[i][j], &hh[i][j], &tt);
		    negt.r = -tt.r;
		    negt.i = -tt.i;
		    zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = dznrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1].r = t;
	    hh[i][i1].i = 0.0;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
	            zd_mult(&vv[i1][k], &vv[i1][k], t);
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		doublecomplex tt = hh[i][k1];
                zz_mult(&tt1, &c[k1], &tt);
                zz_mult(&tt2, &s[k1], &hh[i][k]);
                z_add(&hh[i][k1], &tt1, &tt2);

                zz_mult(&tt1, &s[k1], &tt);
                zz_mult(&tt2, &c[k1], &hh[i][k]);
                z_sub(&hh[i][k], &tt2, &tt1);
	    }

	    double gam = dznrm2_(&i_2, &hh[i][i], &i_1);

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
                gam = 1.0 / gam;
		zd_mult(&c[i], &hh[i][i], gam);
		zd_mult(&s[i], &hh[i][i1], gam);
	    }

	    zz_mult(&rs[i1], &s[i], &rs[i]);
            rs[i1].r = -rs[i1].r;  rs[i1].i = -rs[i1].i;
	    zz_mult(&rs[i], &c[i], &rs[i]);

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
            zz_mult(&tt1, &c[i], &hh[i][i]);
            zz_mult(&tt2, &s[i], &hh[i][i1]);
            z_add(&hh[i][i], &tt1, &tt2);
            beta = z_abs1(&rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	z_div(&rs[i], &rs[i], &hh[i][i]);

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    doublecomplex tt = rs[k];
	    for (int j = k + 1; j <= i; j++) {
                zz_mult(&tt1, &hh[j][k], &rs[j]);
		z_sub(&tt, &tt, &tt1);
            }
            z_div(&rs[k], &tt, &hh[k][k]);
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    doublecomplex tt = rs[j];
	    for (int k = 0; k < n; k++) {
                zz_mult(&tt1, &tt, &z[j][k]);
		z_add(&sol[k], &sol[k], &tt1);
            }
	}

	/* calculate the residual and output */
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = dznrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}